

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aligned.cpp
# Opt level: O0

void __thiscall
Aligned_IsPowerOfTwo_Test::Aligned_IsPowerOfTwo_Test(Aligned_IsPowerOfTwo_Test *this)

{
  Aligned_IsPowerOfTwo_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Aligned_IsPowerOfTwo_Test_00319280;
  return;
}

Assistant:

TEST (Aligned, IsPowerOfTwo) {
    EXPECT_FALSE (pstore::is_power_of_two (0U));
    EXPECT_TRUE (pstore::is_power_of_two (1U));
    EXPECT_TRUE (pstore::is_power_of_two (2U));
    EXPECT_FALSE (pstore::is_power_of_two (3U));
    EXPECT_TRUE (pstore::is_power_of_two (4U));
    EXPECT_FALSE (pstore::is_power_of_two (255U));
    EXPECT_TRUE (pstore::is_power_of_two (256U));
}